

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O2

void __thiscall sorted_ptr_arr<double>::sort(sorted_ptr_arr<double> *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  TLeonardoHeap<smoothsort_ptr<double>_> lh;
  
  if (this->ptr_arr != (smoothsort_ptr<double> *)0x0) {
    TLeonardoHeap<smoothsort_ptr<double>_>::TLeonardoHeap(&lh,this->ptr_arr,this->N);
    lVar1 = -1;
    for (uVar2 = 1; uVar2 < this->N - 1; uVar2 = uVar2 + 1) {
      TLeonardoHeap<smoothsort_ptr<double>_>::dequeue_max(&lh,this->N + lVar1);
      lVar1 = lVar1 + -1;
    }
    return;
  }
  __assert_fail("ptr_arr != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gregreen[P]smoothsort/smoothsort.h"
                ,0x159,"void sorted_ptr_arr<double>::sort() [T = double]");
}

Assistant:

void sort() {
		assert(ptr_arr != NULL);	// Something's gone wrong if the program tries to sort without initializing the data
		TLeonardoHeap< smoothsort_ptr<T> > lh(ptr_arr, N);
		for(size_t i=1; i<N-1; i++) { lh.dequeue_max(N-i); }
	}